

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match_basic_types.cpp
# Opt level: O0

int __thiscall
Potassco::BufferedStream::copy(BufferedStream *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  char cVar1;
  unsigned_long *puVar2;
  size_t m;
  size_t b;
  size_t n;
  size_t os;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 uVar3;
  BufferedStream *this_00;
  unsigned_long local_38;
  unsigned_long local_30;
  char *local_28;
  int local_1c;
  EVP_PKEY_CTX *local_18;
  BufferedStream *local_10;
  int local_4;
  
  local_1c = (int)src;
  local_4 = local_1c;
  if (-1 < local_1c) {
    local_28 = (char *)0x0;
    local_30 = (unsigned_long)local_1c;
    local_18 = dst;
    local_10 = this;
    while( true ) {
      uVar3 = false;
      if (local_30 != 0) {
        cVar1 = peek(this);
        uVar3 = cVar1 != '\0';
      }
      if ((bool)uVar3 == false) break;
      local_38 = 0x1000 - this->rpos_;
      puVar2 = std::min<unsigned_long>(&local_30,&local_38);
      this_00 = (BufferedStream *)*puVar2;
      local_18 = (EVP_PKEY_CTX *)
                 std::copy<char*,char*>
                           ((char *)this_00,(char *)this,
                            (char *)CONCAT17(uVar3,in_stack_ffffffffffffffb0));
      local_30 = local_30 - (long)this_00;
      local_28 = local_28 + (long)&this_00->str_;
      this->rpos_ = (size_t)((long)&this_00->str_ + this->rpos_);
      cVar1 = peek(this);
      if (cVar1 == '\0') {
        underflow(this_00,SUB81((ulong)this >> 0x38,0));
      }
    }
    local_4 = (int)local_28;
  }
  return local_4;
}

Assistant:

int BufferedStream::copy(char* out, int max) {
	if (max < 0) return max;
	std::size_t os = 0;
	for (std::size_t n = static_cast<std::size_t>(max); n && peek();) {
		std::size_t b = (ALLOC_SIZE - rpos_) - 1;
		std::size_t m = std::min(n, b);
		out = std::copy(buf_ + rpos_, buf_ + rpos_ + m, out);
		n -= m;
		os += m;
		rpos_ += m;
		if (!peek()) { underflow(); }
	}
	return static_cast<int>(os);
}